

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O0

int __thiscall
jrtplib::RTCPCompoundPacketBuilder::AddSDESSource(RTCPCompoundPacketBuilder *this,uint32_t ssrc)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  int status;
  size_t sdessizewithextrasource;
  size_t totalotherbytes;
  uint32_t ssrc_local;
  RTCPCompoundPacketBuilder *this_local;
  
  if ((this->arebuilding & 1U) == 0) {
    this_local._4_4_ = -0x2a;
  }
  else {
    sVar1 = this->byesize;
    sVar2 = this->appsize;
    sVar3 = Report::NeededBytes(&this->report);
    sVar4 = SDES::NeededBytesWithExtraSource(&this->sdes);
    if (this->maximumpacketsize < sVar1 + sVar2 + sVar3 + sVar4) {
      this_local._4_4_ = -0x2b;
    }
    else {
      this_local._4_4_ = SDES::AddSSRC(&this->sdes,ssrc);
      if (-1 < this_local._4_4_) {
        this_local._4_4_ = 0;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTCPCompoundPacketBuilder::AddSDESSource(uint32_t ssrc)
{
	if (!arebuilding)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTBUILDING;

#ifndef RTP_SUPPORT_RTCPUNKNOWN
	size_t totalotherbytes = byesize+appsize+report.NeededBytes();
#else
	size_t totalotherbytes = byesize+appsize+unknownsize+report.NeededBytes();
#endif // RTP_SUPPORT_RTCPUNKNOWN 
	size_t sdessizewithextrasource = sdes.NeededBytesWithExtraSource();

	if ((totalotherbytes + sdessizewithextrasource) > maximumpacketsize)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT;

	int status;

	if ((status = sdes.AddSSRC(ssrc)) < 0)
		return status;
	return 0;
}